

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpFinish(void)

{
  UpnpDevice_Handle UVar1;
  Upnp_Handle_Type UVar2;
  UpnpClient_Handle client;
  int iVar3;
  UpnpDevice_Handle device_handle;
  Handle_Info *temp;
  UpnpDevice_Handle local_34;
  Handle_Info *local_30;
  
  iVar3 = -0x74;
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x2b0,
               "Inside UpnpFinish: UpnpSdkInit is %d\n",1);
    if (UpnpSdkInit == 1) {
      UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x2b7,"UpnpFinish: UpnpSdkInit is ONE\n");
    }
    PrintThreadPoolStats(&gSendThreadPool,".upnp/src/api/upnpapi.c",0x2ba,"Send Thread Pool");
    PrintThreadPoolStats(&gRecvThreadPool,".upnp/src/api/upnpapi.c",700,"Recv Thread Pool");
    PrintThreadPoolStats
              (&gMiniServerThreadPool,".upnp/src/api/upnpapi.c",0x2bf,"MiniServer Thread Pool");
    UVar2 = GetDeviceHandleInfo(0,2,&local_34,&local_30);
    if (UVar2 == HND_DEVICE) {
      do {
        UVar1 = local_34;
        UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x5af,"Inside UpnpUnRegisterRootDevice\n"
                  );
        UpnpUnRegisterRootDeviceLowPower(UVar1,-1,-1,-1);
        UVar2 = GetDeviceHandleInfo(0,2,&local_34,&local_30);
      } while (UVar2 == HND_DEVICE);
    }
    UVar2 = GetDeviceHandleInfo(0,10,&local_34,&local_30);
    if (UVar2 == HND_DEVICE) {
      do {
        UVar1 = local_34;
        UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x5af,"Inside UpnpUnRegisterRootDevice\n"
                  );
        UpnpUnRegisterRootDeviceLowPower(UVar1,-1,-1,-1);
        UVar2 = GetDeviceHandleInfo(0,10,&local_34,&local_30);
      } while (UVar2 == HND_DEVICE);
    }
    iVar3 = 1;
    do {
      while( true ) {
        UVar2 = GetHandleInfo(iVar3,&local_30);
        if (UVar2 != HND_CLIENT) break;
        UpnpUnRegisterClient(iVar3);
        iVar3 = 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 200);
    TimerThreadShutdown(&gTimerThread);
    iVar3 = 0;
    StopMiniServer();
    web_server_destroy();
    ThreadPoolShutdown(&gMiniServerThreadPool);
    PrintThreadPoolStats
              (&gMiniServerThreadPool,".upnp/src/api/upnpapi.c",0x2da,"MiniServer Thread Pool");
    ThreadPoolShutdown(&gRecvThreadPool);
    PrintThreadPoolStats(&gSendThreadPool,".upnp/src/api/upnpapi.c",0x2de,"Send Thread Pool");
    ThreadPoolShutdown(&gSendThreadPool);
    PrintThreadPoolStats(&gRecvThreadPool,".upnp/src/api/upnpapi.c",0x2e1,"Recv Thread Pool");
    pthread_mutex_destroy((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    pthread_rwlock_destroy((pthread_rwlock_t *)&GlobalHndRWLock);
    pthread_mutex_destroy((pthread_mutex_t *)&gUUIDMutex);
    UpnpRemoveAllVirtualDirs();
    UpnpSdkInit = 0;
    UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x2ed,
               "Exiting UpnpFinish: UpnpSdkInit is :%d:\n",0);
    UpnpCloseLog();
  }
  return iVar3;
}

Assistant:

int UpnpFinish(void)
{
#ifdef INCLUDE_DEVICE_APIS
	UpnpDevice_Handle device_handle;
#endif
#ifdef INCLUDE_CLIENT_APIS
	UpnpClient_Handle client_handle;
#endif
	struct Handle_Info *temp;
#ifdef UPNP_ENABLE_OPEN_SSL
	if (gSslCtx) {
		SSL_CTX_free(gSslCtx);
		gSslCtx = NULL;
	}
#endif
	if (UpnpSdkInit != 1)
		return UPNP_E_FINISH;
	UpnpPrintf(UPNP_INFO,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpFinish: UpnpSdkInit is %d\n",
		UpnpSdkInit);
	if (UpnpSdkInit == 1)
		UpnpPrintf(UPNP_INFO,
			API,
			__FILE__,
			__LINE__,
			"UpnpFinish: UpnpSdkInit is ONE\n");
	PrintThreadPoolStats(
		&gSendThreadPool, __FILE__, __LINE__, "Send Thread Pool");
	PrintThreadPoolStats(
		&gRecvThreadPool, __FILE__, __LINE__, "Recv Thread Pool");
	PrintThreadPoolStats(&gMiniServerThreadPool,
		__FILE__,
		__LINE__,
		"MiniServer Thread Pool");
#ifdef INCLUDE_DEVICE_APIS
	while (GetDeviceHandleInfo(0, AF_INET, &device_handle, &temp) ==
		HND_DEVICE) {
		UpnpUnRegisterRootDevice(device_handle);
	}
	while (GetDeviceHandleInfo(0, AF_INET6, &device_handle, &temp) ==
		HND_DEVICE) {
		UpnpUnRegisterRootDevice(device_handle);
	}
#endif
#ifdef INCLUDE_CLIENT_APIS
	while (HND_CLIENT == GetClientHandleInfo(&client_handle, &temp)) {
		UpnpUnRegisterClient(client_handle);
	}
#endif
	TimerThreadShutdown(&gTimerThread);
#if EXCLUDE_MINISERVER == 0
	StopMiniServer();
#endif
#if EXCLUDE_WEB_SERVER == 0
	web_server_destroy();
#endif
	ThreadPoolShutdown(&gMiniServerThreadPool);
	PrintThreadPoolStats(&gMiniServerThreadPool,
		__FILE__,
		__LINE__,
		"MiniServer Thread Pool");
	ThreadPoolShutdown(&gRecvThreadPool);
	PrintThreadPoolStats(
		&gSendThreadPool, __FILE__, __LINE__, "Send Thread Pool");
	ThreadPoolShutdown(&gSendThreadPool);
	PrintThreadPoolStats(
		&gRecvThreadPool, __FILE__, __LINE__, "Recv Thread Pool");
#ifdef INCLUDE_CLIENT_APIS
	ithread_mutex_destroy(&GlobalClientSubscribeMutex);
#endif
	ithread_rwlock_destroy(&GlobalHndRWLock);
	ithread_mutex_destroy(&gUUIDMutex);
	/* remove all virtual dirs */
	UpnpRemoveAllVirtualDirs();
	UpnpSdkInit = 0;
	UpnpPrintf(UPNP_INFO,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpFinish: UpnpSdkInit is :%d:\n",
		UpnpSdkInit);
	UpnpCloseLog();
	/* Clean-up ithread library resources */
	ithread_cleanup_library();

	return UPNP_E_SUCCESS;
}